

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

longlong __thiscall
cmsys::SystemInformationImplementation::GetProcMemoryAvailable
          (SystemInformationImplementation *this,char *hostLimitEnvVarName,char *procLimitEnvVarName
          )

{
  int iVar1;
  long lVar2;
  char *__nptr;
  longlong lVar3;
  ResourceLimitType rlim;
  
  lVar2 = GetHostMemoryAvailable(this,hostLimitEnvVarName);
  if (procLimitEnvVarName != (char *)0x0) {
    __nptr = getenv(procLimitEnvVarName);
    if (__nptr != (char *)0x0) {
      lVar3 = atoll(__nptr);
      if ((0 < lVar3) && (lVar3 < lVar2)) {
        lVar2 = lVar3;
      }
    }
  }
  iVar1 = getrlimit64(RLIMIT_DATA,(rlimit64 *)&rlim);
  if ((rlim.rlim_cur != 0xffffffffffffffff && iVar1 == 0) && ((long)rlim.rlim_cur / 0x400 < lVar2))
  {
    lVar2 = (long)rlim.rlim_cur / 0x400;
  }
  iVar1 = getrlimit64(RLIMIT_AS,(rlimit64 *)&rlim);
  if ((rlim.rlim_cur != 0xffffffffffffffff && iVar1 == 0) && ((long)rlim.rlim_cur / 0x400 < lVar2))
  {
    lVar2 = (long)rlim.rlim_cur / 0x400;
  }
  return lVar2;
}

Assistant:

long long SystemInformationImplementation::GetProcMemoryAvailable(
  const char* hostLimitEnvVarName, const char* procLimitEnvVarName)
{
  long long memAvail = this->GetHostMemoryAvailable(hostLimitEnvVarName);

  // the following mechanism is provide for systems where rlimits
  // are not employed. Units are in KiB.
  if (procLimitEnvVarName) {
    const char* procLimitEnvVarValue = getenv(procLimitEnvVarName);
    if (procLimitEnvVarValue) {
      long long procLimit = std::atoll(procLimitEnvVarValue);
      if (procLimit > 0) {
        memAvail = min(procLimit, memAvail);
      }
    }
  }

#if defined(__linux)
  int ierr;
  ResourceLimitType rlim;
  ierr = GetResourceLimit(RLIMIT_DATA, &rlim);
  if ((ierr == 0) && (rlim.rlim_cur != RLIM_INFINITY)) {
    memAvail = min(static_cast<long long>(rlim.rlim_cur) / 1024, memAvail);
  }

  ierr = GetResourceLimit(RLIMIT_AS, &rlim);
  if ((ierr == 0) && (rlim.rlim_cur != RLIM_INFINITY)) {
    memAvail = min(static_cast<long long>(rlim.rlim_cur) / 1024, memAvail);
  }
#elif defined(__APPLE__)
  struct rlimit rlim;
  int ierr;
  ierr = getrlimit(RLIMIT_DATA, &rlim);
  if ((ierr == 0) && (rlim.rlim_cur != RLIM_INFINITY)) {
    memAvail = min(static_cast<long long>(rlim.rlim_cur) / 1024, memAvail);
  }

  ierr = getrlimit(RLIMIT_RSS, &rlim);
  if ((ierr == 0) && (rlim.rlim_cur != RLIM_INFINITY)) {
    memAvail = min(static_cast<long long>(rlim.rlim_cur) / 1024, memAvail);
  }
#endif

  return memAvail;
}